

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

ArchKind llvm::ARM::parseArch(StringRef Arch)

{
  iterator pcVar1;
  size_t in_RDX;
  bool bVar2;
  StringRef SVar3;
  StringRef local_100;
  undefined1 local_f0 [8];
  ArchNames<llvm::ARM::ArchKind> A;
  ArchNames<llvm::ARM::ArchKind> *__end1;
  ArchNames<llvm::ARM::ArchKind> *__begin1;
  ArchNames<llvm::ARM::ArchKind> (*__range1) [33];
  char *local_88;
  StringRef Syn;
  StringRef Arch_local;
  int local_c;
  
  SVar3.Data = (char *)Arch.Length;
  SVar3.Length = in_RDX;
  SVar3 = getCanonicalArchName((ARM *)Arch.Data,SVar3);
  SVar3 = getArchSynonym(SVar3);
  __end1 = (ArchNames<llvm::ARM::ArchKind> *)(anonymous_namespace)::ARCHNames;
  A._56_8_ = &(anonymous_namespace)::CPUNames;
  while( true ) {
    if (__end1 == (ArchNames<llvm::ARM::ArchKind> *)A._56_8_) {
      return INVALID;
    }
    memcpy(local_f0,__end1,0x40);
    local_100 = anon_unknown.dwarf_185e02::ArchNames<llvm::ARM::ArchKind>::getName
                          ((ArchNames<llvm::ARM::ArchKind> *)local_f0);
    local_88 = SVar3.Data;
    Syn.Data = (char *)SVar3.Length;
    bVar2 = false;
    if (Syn.Data <= local_100.Length) {
      pcVar1 = StringRef::end(&local_100);
      if (Syn.Data == (char *)0x0) {
        local_c = 0;
      }
      else {
        local_c = memcmp(pcVar1 + -(long)Syn.Data,local_88,(size_t)Syn.Data);
      }
      bVar2 = local_c == 0;
    }
    if (bVar2) break;
    __end1 = __end1 + 1;
  }
  return A.DefaultFPU;
}

Assistant:

ARM::ArchKind ARM::parseArch(StringRef Arch) {
  Arch = getCanonicalArchName(Arch);
  StringRef Syn = getArchSynonym(Arch);
  for (const auto A : ARCHNames) {
    if (A.getName().endswith(Syn))
      return A.ID;
  }
  return ARM::ArchKind::INVALID;
}